

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

void JSON::writeDictionaryKey(Pipeline *p,bool *first,string *key,size_t depth)

{
  bool *this;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  size_t local_28;
  size_t depth_local;
  string *key_local;
  bool *first_local;
  Pipeline *p_local;
  
  local_28 = depth;
  depth_local = (size_t)key;
  key_local = (string *)first;
  first_local = (bool *)p;
  writeNext(p,first,depth);
  this = first_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"\"",&local_89);
  std::operator+(&local_68,&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)depth_local);
  std::operator+(&local_48,&local_68,"\": ");
  Pipeline::operator<<((Pipeline *)this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  return;
}

Assistant:

void
JSON::writeDictionaryKey(Pipeline* p, bool& first, std::string const& key, size_t depth)
{
    writeNext(p, first, depth);
    *p << std::string("\"") + key + "\": ";
}